

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

void mbedtls_des_setkey(uint32_t *SK,uchar *key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint local_24;
  uint32_t T;
  uint32_t Y;
  uint32_t X;
  int i;
  uchar *key_local;
  uint32_t *SK_local;
  
  uVar1 = (uint)*key << 0x18 | (uint)key[1] << 0x10 | (uint)key[2] << 8 | (uint)key[3];
  uVar2 = (uint)key[4] << 0x18 | (uint)key[5] << 0x10 | (uint)key[6] << 8 | (uint)key[7];
  uVar3 = (uVar2 >> 4 ^ uVar1) & 0xf0f0f0f;
  uVar1 = uVar3 ^ uVar1;
  uVar2 = uVar3 << 4 ^ uVar2;
  uVar2 = (uVar2 ^ uVar1) & 0x10101010 ^ uVar2;
  T = (LHs[uVar1 & 0xf] << 3 | LHs[uVar1 >> 8 & 0xf] << 2 | LHs[uVar1 >> 0x10 & 0xf] << 1 |
       LHs[uVar1 >> 0x18 & 0xf] | LHs[uVar1 >> 5 & 0xf] << 7 | LHs[uVar1 >> 0xd & 0xf] << 6 |
       LHs[uVar1 >> 0x15 & 0xf] << 5 | LHs[((uint)*key << 0x18) >> 0x1d] << 4) & 0xfffffff;
  local_24 = (RHs[uVar2 >> 1 & 0xf] << 3 | RHs[uVar2 >> 9 & 0xf] << 2 |
              RHs[uVar2 >> 0x11 & 0xf] << 1 | RHs[uVar2 >> 0x19 & 0xf] | RHs[uVar2 >> 4 & 0xf] << 7
              | RHs[uVar2 >> 0xc & 0xf] << 6 | RHs[uVar2 >> 0x14 & 0xf] << 5 |
             RHs[uVar2 >> 0x1c] << 4) & 0xfffffff;
  key_local = (uchar *)SK;
  for (Y = 0; (int)Y < 0x10; Y = Y + 1) {
    if ((((int)Y < 2) || (Y == 8)) || (Y == 0xf)) {
      T = (T & 0x7ffffff) << 1 | T >> 0x1b;
      local_24 = (local_24 & 0x7ffffff) << 1 | local_24 >> 0x1b;
    }
    else {
      T = (T & 0x3ffffff) << 2 | T >> 0x1a;
      local_24 = (local_24 & 0x3ffffff) << 2 | local_24 >> 0x1a;
    }
    puVar4 = (uint *)(key_local + 4);
    *(uint32_t *)key_local =
         (T & 0x2400000) << 4 | (T & 1) << 0x1c | (T & 0x2000) << 0xe | (T & 0x82) << 0x12 |
         (T & 0x40000) << 6 | (T & 0x1000) << 9 | T >> 1 & 0x100000 | (T & 0x100) << 10 |
         (T & 0x8000) << 2 | T >> 10 & 0x10000 | local_24 >> 0xd & 0x2000 | local_24 >> 4 & 0x1000 |
         (local_24 & 0x20) << 6 | local_24 >> 1 & 0x400 | local_24 >> 0xe & 0x200 | local_24 & 0x100
         | local_24 >> 5 & 0x20 | local_24 >> 10 & 0x10 | local_24 >> 3 & 8 | local_24 >> 0x12 & 4 |
         local_24 >> 0x1a & 2 | local_24 >> 0x18 & 1;
    key_local = key_local + 8;
    *puVar4 = (T & 0x4000) << 0xf | (T & 0x800) << 0x11 | (T & 0x20000) << 10 | (T & 0x10) << 0x16 |
              T >> 2 & 0x2000000 | (T & 0x800000) << 1 | (T & 0x20) << 0x10 | (T & 0x200) << 0xb |
              (T & 0x10000) << 3 | T >> 6 & 0x40000 | (T & 4) << 0xf | T >> 4 & 0x10000 |
              local_24 >> 2 & 0x2000 | (local_24 & 0x10) << 8 | local_24 >> 0xe & 0x808 |
              local_24 >> 9 & 0x400 | local_24 & 0x200 | (local_24 & 2) << 7 | local_24 >> 7 & 0x20
              | local_24 >> 3 & 0x11 | (local_24 & 1) << 2 | local_24 >> 0x15 & 2;
  }
  return;
}

Assistant:

void mbedtls_des_setkey( uint32_t SK[32], const unsigned char key[MBEDTLS_DES_KEY_SIZE] )
{
    int i;
    uint32_t X, Y, T;

    GET_UINT32_BE( X, key, 0 );
    GET_UINT32_BE( Y, key, 4 );

    /*
     * Permuted Choice 1
     */
    T =  ((Y >>  4) ^ X) & 0x0F0F0F0F;  X ^= T; Y ^= (T <<  4);
    T =  ((Y      ) ^ X) & 0x10101010;  X ^= T; Y ^= (T      );

    X =   (LHs[ (X      ) & 0xF] << 3) | (LHs[ (X >>  8) & 0xF ] << 2)
        | (LHs[ (X >> 16) & 0xF] << 1) | (LHs[ (X >> 24) & 0xF ]     )
        | (LHs[ (X >>  5) & 0xF] << 7) | (LHs[ (X >> 13) & 0xF ] << 6)
        | (LHs[ (X >> 21) & 0xF] << 5) | (LHs[ (X >> 29) & 0xF ] << 4);

    Y =   (RHs[ (Y >>  1) & 0xF] << 3) | (RHs[ (Y >>  9) & 0xF ] << 2)
        | (RHs[ (Y >> 17) & 0xF] << 1) | (RHs[ (Y >> 25) & 0xF ]     )
        | (RHs[ (Y >>  4) & 0xF] << 7) | (RHs[ (Y >> 12) & 0xF ] << 6)
        | (RHs[ (Y >> 20) & 0xF] << 5) | (RHs[ (Y >> 28) & 0xF ] << 4);

    X &= 0x0FFFFFFF;
    Y &= 0x0FFFFFFF;

    /*
     * calculate subkeys
     */
    for( i = 0; i < 16; i++ )
    {
        if( i < 2 || i == 8 || i == 15 )
        {
            X = ((X <<  1) | (X >> 27)) & 0x0FFFFFFF;
            Y = ((Y <<  1) | (Y >> 27)) & 0x0FFFFFFF;
        }
        else
        {
            X = ((X <<  2) | (X >> 26)) & 0x0FFFFFFF;
            Y = ((Y <<  2) | (Y >> 26)) & 0x0FFFFFFF;
        }

        *SK++ =   ((X <<  4) & 0x24000000) | ((X << 28) & 0x10000000)
                | ((X << 14) & 0x08000000) | ((X << 18) & 0x02080000)
                | ((X <<  6) & 0x01000000) | ((X <<  9) & 0x00200000)
                | ((X >>  1) & 0x00100000) | ((X << 10) & 0x00040000)
                | ((X <<  2) & 0x00020000) | ((X >> 10) & 0x00010000)
                | ((Y >> 13) & 0x00002000) | ((Y >>  4) & 0x00001000)
                | ((Y <<  6) & 0x00000800) | ((Y >>  1) & 0x00000400)
                | ((Y >> 14) & 0x00000200) | ((Y      ) & 0x00000100)
                | ((Y >>  5) & 0x00000020) | ((Y >> 10) & 0x00000010)
                | ((Y >>  3) & 0x00000008) | ((Y >> 18) & 0x00000004)
                | ((Y >> 26) & 0x00000002) | ((Y >> 24) & 0x00000001);

        *SK++ =   ((X << 15) & 0x20000000) | ((X << 17) & 0x10000000)
                | ((X << 10) & 0x08000000) | ((X << 22) & 0x04000000)
                | ((X >>  2) & 0x02000000) | ((X <<  1) & 0x01000000)
                | ((X << 16) & 0x00200000) | ((X << 11) & 0x00100000)
                | ((X <<  3) & 0x00080000) | ((X >>  6) & 0x00040000)
                | ((X << 15) & 0x00020000) | ((X >>  4) & 0x00010000)
                | ((Y >>  2) & 0x00002000) | ((Y <<  8) & 0x00001000)
                | ((Y >> 14) & 0x00000808) | ((Y >>  9) & 0x00000400)
                | ((Y      ) & 0x00000200) | ((Y <<  7) & 0x00000100)
                | ((Y >>  7) & 0x00000020) | ((Y >>  3) & 0x00000011)
                | ((Y <<  2) & 0x00000004) | ((Y >> 21) & 0x00000002);
    }
}